

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

value_type __thiscall
andres::
BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
::operator()(BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
             *this,int it)

{
  reference pfVar1;
  reference pfVar2;
  
  pfVar1 = View<float,true,std::allocator<unsigned_long>>::operator()
                     (*(View<float,true,std::allocator<unsigned_long>> **)this,it);
  pfVar2 = View<float,true,std::allocator<unsigned_long>>::operator()
                     (*(View<float,true,std::allocator<unsigned_long>> **)(this + 8),it);
  return *pfVar1 - *pfVar2;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }